

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte_filter_pusher.cpp
# Opt level: O0

void __thiscall duckdb::CTEFilterPusher::FindCandidates(CTEFilterPusher *this,LogicalOperator *op)

{
  bool bVar1;
  pointer pLVar2;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>_>
  *__lhs;
  pointer pMVar3;
  CTEFilterPusher *in_RSI;
  unsigned_long in_RDI;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *child;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *__range1;
  iterator it_1;
  LogicalCTERef *cte_ref_1;
  iterator it;
  LogicalCTERef *cte_ref;
  templated_unique_single_t value;
  string key;
  LogicalOperator *in_stack_fffffffffffffed8;
  vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
  *in_stack_fffffffffffffee0;
  string *in_stack_fffffffffffffee8;
  InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
  *in_stack_fffffffffffffef0;
  LogicalOperator *in_stack_fffffffffffffef8;
  LogicalOperator *in_stack_ffffffffffffff20;
  __normal_iterator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
  local_d0;
  pointer *local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
  *local_c0;
  string local_b8 [32];
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>_>
  local_98;
  LogicalCTERef *local_90;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
  *local_80;
  string local_78 [32];
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>_>
  local_58;
  LogicalCTERef *local_50;
  string local_30 [24];
  LogicalOperator *in_stack_ffffffffffffffe8;
  
  if (*(char *)&(in_RSI->cte_info_map).map.
                super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
                .
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 'O') {
    LogicalOperator::Cast<duckdb::LogicalMaterializedCTE>(in_stack_ffffffffffffff20);
    ::std::__cxx11::to_string(in_RDI);
    make_uniq<duckdb::CTEFilterPusher::MaterializedCTEInfo,duckdb::LogicalOperator&>
              (in_stack_fffffffffffffef8);
    InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
    ::insert(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>
              *)in_stack_fffffffffffffee0);
    unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>
    ::~unique_ptr((unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>
                   *)0xcff6db);
    ::std::__cxx11::string::~string(local_30);
  }
  else {
    if (*(char *)&(in_RSI->cte_info_map).map.
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
                  .
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\x02') {
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                    *)in_stack_fffffffffffffee0,(size_type)in_stack_fffffffffffffed8);
      pLVar2 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)in_stack_fffffffffffffee0);
      if (pLVar2->type == LOGICAL_CTE_REF) {
        vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                      *)in_stack_fffffffffffffee0,(size_type)in_stack_fffffffffffffed8);
        unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
        operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                    *)in_stack_fffffffffffffee0);
        local_50 = LogicalOperator::Cast<duckdb::LogicalCTERef>(in_stack_ffffffffffffff20);
        ::std::__cxx11::to_string(in_RDI);
        local_58._M_current =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
              *)InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
                ::find((InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
                        *)in_stack_fffffffffffffef8,(string *)in_stack_fffffffffffffef0);
        ::std::__cxx11::string::~string(local_78);
        local_80 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
                    *)InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,true>>
                      ::end_abi_cxx11_((InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
                                        *)in_stack_fffffffffffffed8);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>_>
                            *)in_stack_fffffffffffffee0,
                           (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>_>
                            *)in_stack_fffffffffffffed8);
        if (!bVar1) {
          return;
        }
        __gnu_cxx::
        __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>_>
        ::operator->(&local_58);
        unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>
        ::operator->((unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>
                      *)in_stack_fffffffffffffee0);
        ::std::reference_wrapper<duckdb::LogicalOperator>::
        reference_wrapper<duckdb::LogicalOperator&,void,duckdb::LogicalOperator*>
                  ((reference_wrapper<duckdb::LogicalOperator> *)in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffed8);
        ::std::
        vector<std::reference_wrapper<duckdb::LogicalOperator>,_std::allocator<std::reference_wrapper<duckdb::LogicalOperator>_>_>
        ::push_back(in_stack_fffffffffffffee0,(value_type *)in_stack_fffffffffffffed8);
        return;
      }
    }
    if (*(char *)&(in_RSI->cte_info_map).map.
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
                  .
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == '\x1f') {
      local_90 = LogicalOperator::Cast<duckdb::LogicalCTERef>(in_stack_ffffffffffffff20);
      __lhs = (__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>_>
               *)(in_RDI + 8);
      ::std::__cxx11::to_string(in_RDI);
      local_98._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
            *)InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
              ::find((InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
                      *)in_stack_fffffffffffffef8,(string *)in_stack_fffffffffffffef0);
      ::std::__cxx11::string::~string(local_b8);
      local_c0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
                  *)InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,true>>
                    ::end_abi_cxx11_((InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>
                                      *)in_stack_fffffffffffffed8);
      bVar1 = __gnu_cxx::operator!=
                        (__lhs,(__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>_>
                                *)in_stack_fffffffffffffed8);
      if (!bVar1) {
        return;
      }
      __gnu_cxx::
      __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>_>
      ::operator->(&local_98);
      pMVar3 = unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>
               ::operator->((unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>
                             *)__lhs);
      pMVar3->all_cte_refs_are_filtered = false;
      return;
    }
  }
  local_c8 = &(in_RSI->cte_info_map).map.
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::unique_ptr<duckdb::CTEFilterPusher::MaterializedCTEInfo,_std::default_delete<duckdb::CTEFilterPusher::MaterializedCTEInfo>,_true>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_d0._M_current =
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *)
       ::std::
       vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
       ::begin((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                *)in_stack_fffffffffffffed8);
  ::std::
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
  ::end((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
         *)in_stack_fffffffffffffed8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
                             *)in_stack_fffffffffffffee0,
                            (__normal_iterator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
                             *)in_stack_fffffffffffffed8), bVar1) {
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
    ::operator*(&local_d0);
    unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
    operator*((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               *)in_stack_fffffffffffffee0);
    FindCandidates(in_RSI,in_stack_ffffffffffffffe8);
    __gnu_cxx::
    __normal_iterator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>_>
    ::operator++(&local_d0);
  }
  return;
}

Assistant:

void CTEFilterPusher::FindCandidates(LogicalOperator &op) {
	if (op.type == LogicalOperatorType::LOGICAL_MATERIALIZED_CTE) {
		// We encountered a new CTE, add it to the map
		auto key = to_string(op.Cast<LogicalMaterializedCTE>().table_index);
		auto value = make_uniq<MaterializedCTEInfo>(op);

		cte_info_map.insert(key, std::move(value));
	} else if (op.type == LogicalOperatorType::LOGICAL_FILTER &&
	           op.children[0]->type == LogicalOperatorType::LOGICAL_CTE_REF) {
		// We encountered a filtered CTE ref, update the according CTE info
		auto &cte_ref = op.children[0]->Cast<LogicalCTERef>();
		auto it = cte_info_map.find(to_string(cte_ref.cte_index));
		if (it != cte_info_map.end()) {
			it->second->filters.push_back(op);
		}
		return;
	} else if (op.type == LogicalOperatorType::LOGICAL_CTE_REF) {
		// We encountered a CTE ref without a filter on top, so we can't do the optimization
		auto &cte_ref = op.Cast<LogicalCTERef>();
		auto it = cte_info_map.find(to_string(cte_ref.cte_index));
		if (it != cte_info_map.end()) {
			it->second->all_cte_refs_are_filtered = false;
		}
		return;
	}
	for (auto &child : op.children) {
		FindCandidates(*child);
	}
}